

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O0

cupdlp_float diffTwoNormSquared(cupdlp_float *x,cupdlp_float *y,cupdlp_int len)

{
  cupdlp_float tmp;
  int i;
  cupdlp_float res;
  cupdlp_int len_local;
  cupdlp_float *y_local;
  cupdlp_float *x_local;
  
  res = 0.0;
  for (i = 0; i < len; i = i + 1) {
    res = (x[i] - y[i]) * (x[i] - y[i]) + res;
  }
  return res;
}

Assistant:

cupdlp_float diffTwoNormSquared(cupdlp_float *x, cupdlp_float *y,
                                const cupdlp_int len) {
  cupdlp_float res = 0.0;
  for (int i = 0; i < len; i++) {
    cupdlp_float tmp = x[i] - y[i];
    res += tmp * tmp;
  }
  return res;
}